

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O0

FT_Module_Interface tt_get_interface(FT_Module driver,char *tt_interface)

{
  void *pvVar1;
  FT_Module pFVar2;
  SFNT_Service sfnt;
  FT_Module sfntd;
  FT_Module_Interface result;
  FT_Library library;
  char *tt_interface_local;
  FT_Module driver_local;
  
  driver_local = (FT_Module)ft_service_list_lookup(tt_services,tt_interface);
  if (driver_local == (FT_Module)0x0) {
    if (driver == (FT_Module)0x0) {
      driver_local = (FT_Module)0x0;
    }
    else if (driver->library == (FT_Library)0x0) {
      driver_local = (FT_Module)0x0;
    }
    else {
      pFVar2 = FT_Get_Module(driver->library,"sfnt");
      if ((pFVar2 == (FT_Module)0x0) ||
         (pvVar1 = pFVar2->clazz->module_interface, pvVar1 == (void *)0x0)) {
        driver_local = (FT_Module)0x0;
      }
      else {
        driver_local = (FT_Module)(**(code **)((long)pvVar1 + 0x20))(driver,tt_interface);
      }
    }
  }
  return driver_local;
}

Assistant:

FT_CALLBACK_DEF( FT_Module_Interface )
  tt_get_interface( FT_Module    driver,    /* TT_Driver */
                    const char*  tt_interface )
  {
    FT_Library           library;
    FT_Module_Interface  result;
    FT_Module            sfntd;
    SFNT_Service         sfnt;


    /* TT_SERVICES_GET dereferences `library' in PIC mode */
#ifdef FT_CONFIG_OPTION_PIC
    if ( !driver )
      return NULL;
    library = driver->library;
    if ( !library )
      return NULL;
#endif

    result = ft_service_list_lookup( TT_SERVICES_GET, tt_interface );
    if ( result )
      return result;

#ifndef FT_CONFIG_OPTION_PIC
    if ( !driver )
      return NULL;
    library = driver->library;
    if ( !library )
      return NULL;
#endif

    /* only return the default interface from the SFNT module */
    sfntd = FT_Get_Module( library, "sfnt" );
    if ( sfntd )
    {
      sfnt = (SFNT_Service)( sfntd->clazz->module_interface );
      if ( sfnt )
        return sfnt->get_interface( driver, tt_interface );
    }

    return 0;
  }